

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BayesianProbitRegressor::SharedCtor(BayesianProbitRegressor *this)

{
  string *psVar1;
  BayesianProbitRegressor *this_local;
  
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->regressioninputfeaturename_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->optimisminputfeaturename_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->samplingscaleinputfeaturename_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->samplingtruncationinputfeaturename_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->meanoutputfeaturename_,psVar1)
  ;
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->varianceoutputfeaturename_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->pessimisticprobabilityoutputfeaturename_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->sampledprobabilityoutputfeaturename_,psVar1);
  memset(&this->bias_,0,0xc);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void BayesianProbitRegressor::SharedCtor() {
  regressioninputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  optimisminputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  samplingscaleinputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  samplingtruncationinputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  meanoutputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  varianceoutputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  pessimisticprobabilityoutputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  sampledprobabilityoutputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  ::memset(&bias_, 0, reinterpret_cast<char*>(&numberoffeatures_) -
    reinterpret_cast<char*>(&bias_) + sizeof(numberoffeatures_));
  _cached_size_ = 0;
}